

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Vector<float,3>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  long lVar1;
  IVal *pIVar2;
  byte bVar3;
  ostringstream oss;
  undefined8 uStack_1e0;
  IVal local_1d8;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  bVar3 = 0;
  uStack_1e0 = 0x7c373b;
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar1 = 8;
  do {
    *(undefined1 *)((long)local_1d8.m_data + lVar1 + -8) = 0;
    *(undefined8 *)(&local_1d8.m_data[0].m_hasNaN + lVar1) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1d8.m_data[0].m_lo + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x50);
  pIVar2 = &local_1d8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pIVar2 = *(undefined8 *)fmt;
    fmt = (FloatFormat *)((long)fmt + (ulong)bVar3 * -0x10 + 8);
    pIVar2 = (IVal *)((long)pIVar2 + ((ulong)bVar3 * -2 + 1) * 8);
  }
  uStack_1e0 = 0x7c377b;
  ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doPrintIVal
            ((FloatFormat *)this,&local_1d8,(ostream *)local_190);
  uStack_1e0 = 0x7c3788;
  std::__cxx11::stringbuf::str();
  uStack_1e0 = 0x7c3799;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uStack_1e0 = 0x7c37a6;
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}